

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::exponent_part(spec *s)

{
  initializer_list<unsigned_char> cs;
  initializer_list<unsigned_char> cs_00;
  character_either *in_RDI;
  spec *in_stack_00000008;
  character_either *s_00;
  maybe *in_stack_ffffffffffffff40;
  sequence *in_stack_ffffffffffffff48;
  character_either *in_stack_ffffffffffffff50;
  character_either *in_stack_ffffffffffffff58;
  sequence *in_stack_ffffffffffffff60;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 *local_88;
  undefined8 local_80;
  character_either local_78;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 *local_40;
  undefined8 local_38;
  
  local_42 = 0x65;
  local_41 = 0x45;
  local_40 = &local_42;
  local_38 = 2;
  cs._M_len = (size_type)in_stack_ffffffffffffff60;
  cs._M_array = (iterator)in_stack_ffffffffffffff58;
  character_either::character_either(in_stack_ffffffffffffff50,cs);
  local_8a = 0x2b;
  local_89 = 0x2d;
  local_88 = &local_8a;
  local_80 = 2;
  s_00 = &local_78;
  cs_00._M_len = (size_type)in_stack_ffffffffffffff60;
  cs_00._M_array = (iterator)in_stack_ffffffffffffff58;
  character_either::character_either(in_stack_ffffffffffffff50,cs_00);
  maybe::maybe<toml::detail::character_either>(in_stack_ffffffffffffff40,s_00);
  zero_prefixable_int(in_stack_00000008);
  sequence::sequence<toml::detail::character_either,toml::detail::maybe,toml::detail::sequence>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(maybe *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  sequence::~sequence((sequence *)in_RDI);
  maybe::~maybe((maybe *)in_RDI);
  character_either::~character_either(in_RDI);
  character_either::~character_either(in_RDI);
  return (sequence *)in_RDI;
}

Assistant:

TOML11_INLINE sequence exponent_part(const spec& s)
{
    return sequence(
            character_either{char_type('e'), char_type('E')},
            maybe(character_either{char_type('+'), char_type('-')}),
            zero_prefixable_int(s)
        );
}